

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

void nni_aio_sys_fini(void)

{
  long lVar1;
  
  if (0 < nni_aio_expire_q_cnt) {
    lVar1 = 0;
    do {
      nni_aio_expire_q_free(nni_aio_expire_q_list[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < nni_aio_expire_q_cnt);
  }
  nni_free(nni_aio_expire_q_list,(long)nni_aio_expire_q_cnt << 3);
  nni_aio_expire_q_cnt = 0;
  nni_aio_expire_q_list = (nni_aio_expire_q **)0x0;
  return;
}

Assistant:

void
nni_aio_sys_fini(void)
{
	for (int i = 0; i < nni_aio_expire_q_cnt; i++) {
		nni_aio_expire_q_free(nni_aio_expire_q_list[i]);
	}
	nni_free(nni_aio_expire_q_list,
	    sizeof(nni_aio_expire_q *) * nni_aio_expire_q_cnt);
	nni_aio_expire_q_cnt  = 0;
	nni_aio_expire_q_list = NULL;
}